

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::WriteHash
          (WrapperFieldGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  FieldDescriptor *pFVar2;
  size_t sVar3;
  char *__s;
  string_view text;
  
  pDVar1 = FieldDescriptor::message_type((this->super_FieldGeneratorBase).descriptor_);
  pFVar2 = Descriptor::field(pDVar1,0);
  if (pFVar2->type_ == '\x02') {
    __s = 
    "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableSingleEqualityComparer.GetHashCode($property_name$);\n"
    ;
  }
  else {
    pDVar1 = FieldDescriptor::message_type((this->super_FieldGeneratorBase).descriptor_);
    pFVar2 = Descriptor::field(pDVar1,0);
    __s = "if ($has_property_check$) hash ^= $property_name$.GetHashCode();\n";
    if (pFVar2->type_ == '\x01') {
      __s = 
      "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableDoubleEqualityComparer.GetHashCode($property_name$);\n"
      ;
    }
  }
  sVar3 = strlen(__s);
  text._M_str = __s;
  text._M_len = sVar3;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_FieldGeneratorBase).variables_,text);
  return;
}

Assistant:

void WrapperFieldGenerator::WriteHash(io::Printer* printer) {
  const char *text = "if ($has_property_check$) hash ^= $property_name$.GetHashCode();\n";
  if (descriptor_->message_type()->field(0)->type() == FieldDescriptor::TYPE_FLOAT) {
    text = "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableSingleEqualityComparer.GetHashCode($property_name$);\n";
  }
  else if (descriptor_->message_type()->field(0)->type() == FieldDescriptor::TYPE_DOUBLE) {
    text = "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableDoubleEqualityComparer.GetHashCode($property_name$);\n";
  }
  printer->Print(variables_, text);
}